

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O3

ref<immutable::rrb<char,_true,_5>_> __thiscall
immutable::rrb_details::push_down_tail<char,true,5>
          (rrb_details *this,ref<immutable::rrb<char,_true,_5>_> *in,
          ref<immutable::rrb<char,_true,_5>_> *new_rrb,
          ref<immutable::rrb_details::leaf_node<char,_true>_> *new_tail)

{
  uint32_t *puVar1;
  atomic<unsigned_int> *paVar2;
  tree_node<char,_true> *ptVar3;
  long lVar4;
  rrb_size_table<true> *__ptr;
  byte bVar5;
  ref<immutable::rrb<char,_true,_5>_> *prVar6;
  ref<immutable::rrb_details::internal_node<char,_true>_> *to_set;
  ref<immutable::rrb_details::internal_node<char,true>> *prVar7;
  internal_node<char,_true> *piVar8;
  rrb_size_table<true> *prVar9;
  uint uVar10;
  char *__function;
  uint uVar11;
  uint32_t uVar12;
  uint32_t k;
  atomic<unsigned_int> *paVar13;
  rrb<char,_true,_5> *prVar14;
  uint uVar15;
  uint uVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  ref<immutable::rrb_details::leaf_node<char,_true>_> old_tail;
  ref<immutable::rrb_details::internal_node<char,_true>_> current;
  ref<immutable::rrb_details::leaf_node<char,_true>_> local_58;
  ref<immutable::rrb_details::internal_node<char,_true>_> local_50;
  ref<immutable::rrb_details::internal_node<char,_true>_> local_48;
  rrb<char,_true,_5> *local_40;
  ref<immutable::rrb<char,_true,_5>_> *local_38;
  
  prVar14 = new_rrb->ptr;
  if (prVar14 != (rrb<char,_true,_5> *)0x0) {
    local_58.ptr = (prVar14->tail).ptr;
    if (local_58.ptr != (leaf_node<char,_true> *)0x0) {
      LOCK();
      ((local_58.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
           ((local_58.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
      prVar14 = new_rrb->ptr;
      if (prVar14 == (rrb<char,_true,_5> *)0x0) goto LAB_00116e14;
    }
    ref<immutable::rrb_details::leaf_node<char,_true>_>::operator=(&prVar14->tail,new_tail);
    prVar14 = in->ptr;
    if (prVar14 != (rrb<char,_true,_5> *)0x0) {
      piVar8 = (internal_node<char,_true> *)(prVar14->root).ptr;
      if (piVar8 == (internal_node<char,_true> *)0x0) {
        prVar14 = new_rrb->ptr;
        if (prVar14 != (rrb<char,_true,_5> *)0x0) {
          prVar14->shift = 0;
          if (local_58.ptr != (leaf_node<char,_true> *)0x0) {
            LOCK();
            ((local_58.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
                 ((local_58.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
            UNLOCK();
          }
          local_50.ptr = (internal_node<char,_true> *)(prVar14->root).ptr;
          (prVar14->root).ptr = (tree_node<char,_true> *)local_58.ptr;
          ref<immutable::rrb_details::tree_node<char,_true>_>::~ref
                    ((ref<immutable::rrb_details::tree_node<char,_true>_> *)&local_50);
          prVar14 = new_rrb->ptr;
          *(rrb<char,_true,_5> **)this = prVar14;
          if (prVar14 != (rrb<char,_true,_5> *)0x0) {
            LOCK();
            (prVar14->_ref_count).super___atomic_base<unsigned_int>._M_i =
                 (prVar14->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
            UNLOCK();
          }
          goto LAB_00116dee;
        }
      }
      else {
        uVar18 = prVar14->cnt;
        LOCK();
        (piVar8->_ref_count).super___atomic_base<unsigned_int>._M_i =
             (piVar8->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
        UNLOCK();
        local_48.ptr = piVar8;
        local_38 = in;
        if (in->ptr != (rrb<char,_true,_5> *)0x0) {
          uVar16 = in->ptr->shift;
          uVar12 = 0;
          local_40 = (rrb<char,_true,_5> *)this;
          if (uVar16 < 6) {
            uVar18 = 0;
          }
          else {
            uVar15 = uVar18 - 1;
            uVar12 = 0;
            uVar17 = 0;
            do {
              prVar9 = ((local_48.ptr)->size_table).ptr;
              if (prVar9 == (rrb_size_table<true> *)0x0) {
                bVar5 = (byte)uVar16;
                k = uVar12;
                if (uVar15 >> (bVar5 + 5 & 0x1f) == 0) {
                  uVar11 = uVar15 >> (bVar5 & 0x1f) & 0x1f;
                  uVar15 = uVar15 & ~(0x1f << (bVar5 & 0x1f));
                  uVar10 = (local_48.ptr)->len;
                  goto LAB_00116b43;
                }
LAB_00116c18:
                uVar18 = uVar17 + (uVar16 - 6) / 5 + 2;
                goto LAB_00116c2f;
              }
              uVar10 = (local_48.ptr)->len;
              uVar11 = uVar10 - 1;
              if (uVar11 == 0) {
                uVar11 = 0;
                uVar10 = 1;
                uVar12 = uVar17 + 1;
              }
              else {
                uVar15 = uVar15 - prVar9->size[uVar10 - 2];
LAB_00116b43:
                if (uVar11 < 0x1f) {
                  uVar12 = uVar17 + 1;
                }
              }
              uVar18 = uVar17 + 1;
              if (uVar11 < uVar10) {
                ref<immutable::rrb_details::internal_node<char,_true>_>::operator=
                          (&local_48,(local_48.ptr)->child + uVar11);
              }
              else {
                local_50.ptr = (internal_node<char,_true> *)0x0;
                ref<immutable::rrb_details::internal_node<char,_true>_>::operator=
                          (&local_48,&local_50);
                release<char>(local_50.ptr);
              }
              k = uVar18;
              if (local_48.ptr == (internal_node<char,_true> *)0x0) goto LAB_00116c18;
              uVar16 = uVar16 - 5;
              uVar17 = uVar18;
            } while (5 < uVar16);
          }
          k = uVar12;
          if ((uVar16 != 0) && (uVar18 = uVar18 + 1, (local_48.ptr)->len < 0x20)) {
            k = uVar18;
          }
LAB_00116c2f:
          if (k != 0) {
            if (local_58.ptr == (leaf_node<char,_true> *)0x0) {
LAB_00116e33:
              __function = 
              "T *immutable::ref<immutable::rrb_details::leaf_node<char, true>>::operator->() const [T = immutable::rrb_details::leaf_node<char, true>]"
              ;
              goto LAB_00116e29;
            }
            to_set = copy_first_k<char,true,5>(local_38,new_rrb,k,(local_58.ptr)->len);
            prVar7 = (ref<immutable::rrb_details::internal_node<char,true>> *)
                     append_empty<char,true>(to_set,uVar18 - k);
            this = (rrb_details *)local_40;
            ref<immutable::rrb_details::internal_node<char,true>>::operator=(prVar7,&local_58);
LAB_00116dd5:
            prVar14 = new_rrb->ptr;
            *(rrb<char,_true,_5> **)this = prVar14;
            if (prVar14 != (rrb<char,_true,_5> *)0x0) {
              LOCK();
              (prVar14->_ref_count).super___atomic_base<unsigned_int>._M_i =
                   (prVar14->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
              UNLOCK();
            }
            release<char>(local_48.ptr);
LAB_00116dee:
            if (local_58.ptr != (leaf_node<char,_true> *)0x0) {
              LOCK();
              paVar13 = &(local_58.ptr)->_ref_count;
              (paVar13->super___atomic_base<unsigned_int>)._M_i =
                   (paVar13->super___atomic_base<unsigned_int>)._M_i - 1;
              UNLOCK();
              if ((paVar13->super___atomic_base<unsigned_int>)._M_i == 0) {
                free(local_58.ptr);
              }
            }
            return (ref<immutable::rrb<char,_true,_5>_>)(rrb<char,_true,_5> *)this;
          }
          piVar8 = (internal_node<char,_true> *)malloc(0x30);
          prVar6 = local_38;
          piVar8->type = INTERNAL_NODE;
          piVar8->len = 2;
          (piVar8->size_table).ptr = (rrb_size_table<true> *)0x0;
          piVar8->guid = 0;
          piVar8->child = (ref<immutable::rrb_details::internal_node<char,_true>_> *)(piVar8 + 1);
          piVar8[1].type = LEAF_NODE;
          piVar8[1].len = 0;
          piVar8[1]._ref_count = (__atomic_base<unsigned_int>)0x0;
          piVar8[1].guid = 0;
          LOCK();
          (piVar8->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
          UNLOCK();
          if (local_38->ptr != (rrb<char,_true,_5> *)0x0) {
            ref<immutable::rrb_details::internal_node<char,true>>::operator=
                      ((ref<immutable::rrb_details::internal_node<char,true>> *)(piVar8 + 1),
                       &local_38->ptr->root);
            prVar14 = new_rrb->ptr;
            if (prVar14 != (rrb<char,_true,_5> *)0x0) {
              LOCK();
              (piVar8->_ref_count).super___atomic_base<unsigned_int>._M_i =
                   (piVar8->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
              UNLOCK();
              local_50.ptr = (internal_node<char,_true> *)(prVar14->root).ptr;
              (prVar14->root).ptr = (tree_node<char,_true> *)piVar8;
              ref<immutable::rrb_details::tree_node<char,_true>_>::~ref
                        ((ref<immutable::rrb_details::tree_node<char,_true>_> *)&local_50);
              if (new_rrb->ptr != (rrb<char,_true,_5> *)0x0) {
                puVar1 = &new_rrb->ptr->shift;
                *puVar1 = *puVar1 + 5;
                prVar14 = prVar6->ptr;
                if (prVar14 != (rrb<char,_true,_5> *)0x0) {
                  ptVar3 = (prVar14->root).ptr;
                  if (ptVar3 == (tree_node<char,_true> *)0x0) {
                    __function = 
                    "T *immutable::ref<immutable::rrb_details::tree_node<char, true>>::operator->() const [T = immutable::rrb_details::tree_node<char, true>]"
                    ;
                    goto LAB_00116e29;
                  }
                  if ((ptVar3->type != LEAF_NODE) &&
                     (lVar4._0_4_ = ptVar3[1].type, lVar4._4_4_ = ptVar3[1].len, lVar4 != 0)) {
                    prVar9 = (rrb_size_table<true> *)malloc(0x18);
                    prVar9->size = (uint32_t *)(prVar9 + 1);
                    prVar9->guid = 0;
                    LOCK();
                    (prVar9->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
                    UNLOCK();
                    if (local_58.ptr == (leaf_node<char,_true> *)0x0) goto LAB_00116e33;
                    *(uint32_t *)&prVar9[1].size = prVar14->cnt - (local_58.ptr)->len;
                    *(uint32_t *)((long)&prVar9[1].size + 4) = prVar14->cnt;
                    LOCK();
                    (prVar9->_ref_count).super___atomic_base<unsigned_int>._M_i =
                         (prVar9->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
                    UNLOCK();
                    paVar13 = &prVar9->_ref_count;
                    __ptr = (piVar8->size_table).ptr;
                    (piVar8->size_table).ptr = prVar9;
                    if (__ptr != (rrb_size_table<true> *)0x0) {
                      LOCK();
                      paVar2 = &__ptr->_ref_count;
                      (paVar2->super___atomic_base<unsigned_int>)._M_i =
                           (paVar2->super___atomic_base<unsigned_int>)._M_i - 1;
                      UNLOCK();
                      if ((paVar2->super___atomic_base<unsigned_int>)._M_i == 0) {
                        free(__ptr);
                      }
                    }
                    LOCK();
                    (paVar13->super___atomic_base<unsigned_int>)._M_i =
                         (paVar13->super___atomic_base<unsigned_int>)._M_i - 1;
                    UNLOCK();
                    if ((paVar13->super___atomic_base<unsigned_int>)._M_i == 0) {
                      free(prVar9);
                    }
                  }
                  if (new_rrb->ptr != (rrb<char,_true,_5> *)0x0) {
                    prVar7 = (ref<immutable::rrb_details::internal_node<char,true>> *)
                             append_empty<char,true>
                                       ((ref<immutable::rrb_details::internal_node<char,_true>_> *)
                                        (*(long *)&(new_rrb->ptr->root).ptr[1]._ref_count + 8),
                                        uVar18);
                    ref<immutable::rrb_details::internal_node<char,true>>::operator=
                              (prVar7,&local_58);
                    release<char>(piVar8);
                    this = (rrb_details *)local_40;
                    goto LAB_00116dd5;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00116e14:
  __function = 
  "T *immutable::ref<immutable::rrb<char>>::operator->() const [T = immutable::rrb<char>]";
LAB_00116e29:
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,__function);
}

Assistant:

inline ref<rrb<T, atomic_ref_counting, N>> push_down_tail(const ref<rrb<T, atomic_ref_counting, N>>& in, const ref<rrb<T, atomic_ref_counting, N>>& new_rrb, const ref<leaf_node<T, atomic_ref_counting>>& new_tail)
      {
      ref<leaf_node<T, atomic_ref_counting>> old_tail = new_rrb->tail;
      new_rrb->tail = new_tail;
      //if (in->cnt <= bits<N>::rrb_branching)
      if (in->root.ptr == nullptr) // [JanM] old code is commented out above. Fixed this due to bug, see unit test test_bug_concat in vector_tests.cpp
        {
        new_rrb->shift = 0;
        new_rrb->root = old_tail;
        return new_rrb;
        }

      // Copyable count starts here

      // TODO: Can find last rightmost jump in constant time for pvec subvecs:
      // use the fact that (index & large_mask) == 1 << (RRB_BITS * H) - 1 -> 0 etc.

      uint32_t index = in->cnt - 1;

      uint32_t nodes_to_copy = 0;
      uint32_t nodes_visited = 0;
      uint32_t pos = 0; // pos is the position we insert empty nodes in the bottom
                        // copyable node (or the element, if we can copy the leaf)
      ref<internal_node<T, atomic_ref_counting>> current = in->root;
      uint32_t shift = in->shift;

      // checking all non-leaf nodes (or if tail, all but the lowest two levels)
      while (shift > bits<N>::rrb_bits)
        {
        // calculate child index
        uint32_t child_index;
        if (current->size_table.ptr == nullptr)
          {
          // some check here to ensure we're not overflowing the pvec subvec.
          // important to realise that this only needs to be done once in a better
          // impl, the same way the size_table check only has to be done until it's
          // false.
          const uint32_t prev_shift = shift + bits<N>::rrb_bits;
          if (index >> prev_shift > 0)
            {
            nodes_visited++; // this could possibly be done earlier in the code.
            goto copyable_count_end;
            }
          child_index = (index >> shift) & bits<N>::rrb_mask;
          // index filtering is not necessary when the check above is performed at
          // most once.
          index &= ~(bits<N>::rrb_mask << shift);
          }
        else
          {
          // no need for sized_pos here, luckily.
          child_index = current->len - 1;
          // Decrement index
          if (child_index != 0)
            {
            index -= current->size_table->size[child_index - 1];
            }
          }
        nodes_visited++;
        if (child_index < bits<N>::rrb_mask)
          {
          nodes_to_copy = nodes_visited;
          pos = child_index;
          }

        if (child_index < current->len)
          current = current->child[child_index];
        else
          current = ref<internal_node<T, atomic_ref_counting>>();
        // This will only happen in a pvec subtree
        if (current.ptr == nullptr)
          {
          nodes_to_copy = nodes_visited;
          pos = child_index;

          // if next element we're looking at is null, we can copy all above. Good
          // times.
          goto copyable_count_end;
          }
        shift -= bits<N>::rrb_bits;
        }
      // if we're here, we're at the leaf node (or lowest non-leaf), which is
      // `current`

      // no need to even use index here: We know it'll be placed at current->len,
      // if there's enough space. That check is easy.
      if (shift != 0)
        {
        nodes_visited++;
        if (current->len < bits<N>::rrb_branching)
          {
          nodes_to_copy = nodes_visited;
          pos = current->len;
          }
        }

    copyable_count_end:
      // GURRHH, nodes_visited is not yet handled nicely. for loop down to get
      // nodes_visited set straight.
      while (shift > bits<N>::rrb_bits)
        {
        nodes_visited++;
        shift -= bits<N>::rrb_bits;
        }

      // Increasing height of tree.
      if (nodes_to_copy == 0)
        {
        ref<internal_node<T, atomic_ref_counting>> new_root = internal_node_create<T, atomic_ref_counting>(2);
        new_root->child[0] = in->root;
        new_rrb->root = new_root;
        new_rrb->shift = new_rrb->shift + bits<N>::rrb_bits;

        // create size table if the original rrb root has a size table.
        if (in->root->type != LEAF_NODE && ((const internal_node<T, atomic_ref_counting> *)in->root.ptr)->size_table.ptr != nullptr)
          {
          ref<rrb_size_table<atomic_ref_counting>> table = size_table_create<atomic_ref_counting>(2);
          table->size[0] = in->cnt - old_tail->len;
          // If we insert the tail, the old size minus the old tail size will be the
          // amount of elements in the left branch. If there is no tail, the size is
          // just the old rrb-tree.

          table->size[1] = in->cnt;
          // If we insert the tail, the old size would include the tail.
          // Consequently, it has to be the old size. If we have no tail, we append
          // a single element to the old vector, therefore it has to be one more
          // than the original.

          new_root->size_table = table;
          }

        // nodes visited == original rrb tree height. Nodes visited > 0.
        ref<internal_node<T, atomic_ref_counting>>* to_set = append_empty(&((internal_node<T, atomic_ref_counting> *)new_rrb->root.ptr)->child[1], nodes_visited);
        *to_set = old_tail;
        }
      else
        {
        ref<internal_node<T, atomic_ref_counting>>* node = copy_first_k(in, new_rrb, nodes_to_copy, old_tail->len);
        ref<internal_node<T, atomic_ref_counting>>* to_set = append_empty(node, nodes_visited - nodes_to_copy);
        *to_set = old_tail;
        }
      return new_rrb;
      }